

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_strings.hpp
# Opt level: O3

char * __thiscall
ELFIO::string_section_accessor_template<ELFIO::section>::get_string
          (string_section_accessor_template<ELFIO::section> *this,Elf_Word index)

{
  ulong uVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar4;
  void *pvVar5;
  char *pcVar6;
  long lVar3;
  undefined4 extraout_var_00;
  
  if (this->string_section != (section *)0x0) {
    uVar1 = (ulong)index;
    iVar2 = (*this->string_section->_vptr_section[0x18])();
    lVar3 = CONCAT44(extraout_var,iVar2);
    iVar2 = (*this->string_section->_vptr_section[0x13])();
    uVar4 = CONCAT44(extraout_var_00,iVar2);
    if (lVar3 != 0 && (uVar1 <= uVar4 && uVar4 - uVar1 != 0)) {
      pvVar5 = memchr((char *)(uVar1 + lVar3),0,uVar4 - uVar1);
      pcVar6 = (char *)0x0;
      if (pvVar5 < (void *)(uVar4 + lVar3)) {
        pcVar6 = (char *)(uVar1 + lVar3);
      }
      if (pvVar5 != (void *)0x0) {
        return pcVar6;
      }
      return (char *)0x0;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* get_string( Elf_Word index ) const
    {
        if ( string_section ) {
            const char* data = string_section->get_data();
            size_t      section_size =
                static_cast<size_t>( string_section->get_size() );

            // Check if index is within bounds
            if ( index >= section_size || nullptr == data ) {
                return nullptr;
            }

            // Check for integer overflow in size calculation
            size_t remaining_size = section_size - index;
            if ( remaining_size > section_size ) { // Check for underflow
                return nullptr;
            }

            // Use standard C++ functions to find string length
            const char* str = data + index;
            const char* end =
                (const char*)std::memchr( str, '\0', remaining_size );
            if ( end != nullptr && end < str + remaining_size ) {
                return str;
            }
        }

        return nullptr;
    }